

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::CommitBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
               *this,TEmitBufferAllocation *allocation,size_t destBufferBytes,BYTE *destBuffer,
              size_t bytes,BYTE *sourceBuffer,DWORD alignPad)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ulong dwSize;
  BYTE *dst;
  size_t count;
  ulong uVar6;
  size_t sVar7;
  BYTE *buffer;
  ulong uVar8;
  BYTE *local_80;
  ulong local_58;
  undefined4 *local_50;
  uint local_34;
  
  if (destBuffer == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1cf,"(destBuffer != nullptr)","destBuffer != nullptr");
    if (!bVar3) goto LAB_003ecb92;
    *puVar5 = 0;
  }
  if (allocation == (TEmitBufferAllocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d0,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar3) goto LAB_003ecb92;
    *puVar5 = 0;
  }
  if (allocation->bytesCommitted != destBufferBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d4,"(destBufferBytes == allocation->bytesCommitted)",
                       "destBufferBytes == allocation->bytesCommitted");
    if (!bVar3) goto LAB_003ecb92;
    *puVar5 = 0;
  }
  sVar7 = allocation->bytesUsed;
  dwSize = alignPad + bytes;
  if (destBufferBytes < dwSize + sVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d7,"(allocation->bytesUsed + bytes + alignPad <= destBufferBytes)",
                       "allocation->bytesUsed + bytes + alignPad <= destBufferBytes");
    if (!bVar3) goto LAB_003ecb92;
    *puVar5 = 0;
    sVar7 = allocation->bytesUsed;
  }
  pcVar1 = allocation->allocation->address;
  if ((uint)((int)allocation->bytesCommitted - (int)sVar7) < dwSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_50 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1db,"(allocation->BytesFree() >= bytes + alignPad)",
                       "allocation->BytesFree() >= bytes + alignPad");
    if (!bVar3) {
LAB_003ecb92:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_50 = 0;
  }
  else {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  buffer = destBuffer + sVar7;
  local_80 = sourceBuffer;
  local_58 = dwSize;
  do {
    if (local_58 == 0) {
      BVar4 = FlushInstructionCache(this->processHandle,pcVar1 + sVar7,dwSize);
      if (BVar4 == 0) {
        return false;
      }
      this->totalBytesCode = this->totalBytesCode + bytes;
      bVar3 = FinalizeAllocation(this,allocation,destBuffer);
      return bVar3;
    }
    if (buffer < destBuffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e4,"(destBuffer <= currentDestBuffer)",
                         "destBuffer <= currentDestBuffer");
      if (!bVar3) goto LAB_003ecb92;
      *local_50 = 0;
    }
    if (destBuffer + destBufferBytes <= buffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e5,"(currentDestBuffer < destBuffer + destBufferBytes)",
                         "currentDestBuffer < destBuffer + destBufferBytes");
      if (!bVar3) goto LAB_003ecb92;
      *local_50 = 0;
    }
    local_34 = 0x1000 - ((uint)buffer & 0xfff);
    uVar6 = (ulong)local_34;
    if (local_58 < local_34) {
      uVar6 = local_58;
    }
    bVar3 = CheckCommitFaultInjection(this);
    if (bVar3) {
      return false;
    }
    BVar4 = Memory::CustomHeap::
            Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
            ProtectAllocationWithExecuteReadWrite
                      (&this->allocationHeap,allocation->allocation,(char *)buffer);
    if (BVar4 == 0) {
      return false;
    }
    dst = buffer;
    count = uVar6;
    if (alignPad == 0) {
LAB_003eca33:
      local_34 = 0;
LAB_003eca3a:
      uVar8 = (ulong)(uint)((int)allocation->bytesCommitted - (int)allocation->bytesUsed);
      if (destBuffer + destBufferBytes < dst + uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_50 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,0x213,
                           "(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes)",
                           "currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes");
        if (!bVar3) goto LAB_003ecb92;
        *local_50 = 0;
      }
      memcpy_s(dst,uVar8,local_80,count);
      dst = dst + count;
      local_80 = local_80 + count;
      allocation->bytesUsed = allocation->bytesUsed + count;
      local_58 = local_58 - count;
    }
    else {
      if (alignPad < local_34) {
        local_34 = alignPad;
      }
      uVar8 = (ulong)local_34;
      Memory::CustomHeap::FillDebugBreak(buffer,uVar8);
      allocation->bytesUsed = allocation->bytesUsed + uVar8;
      local_34 = alignPad - local_34;
      this->totalBytesAlignment = this->totalBytesAlignment + uVar8;
      dst = buffer + uVar8;
      local_58 = local_58 - uVar8;
      count = uVar6 - uVar8;
      if (count != 0) {
        if (local_34 == 0) goto LAB_003eca33;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_50 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,0x20e,"(alignPad == 0)",
                           "If we are copying right now - we should be done with setting alignment."
                          );
        if (bVar3) {
          *local_50 = 0;
          goto LAB_003eca3a;
        }
        goto LAB_003ecb92;
      }
    }
    if (buffer + uVar6 != dst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x21c,"(readWriteBuffer + readWriteBytes == currentDestBuffer)",
                         "readWriteBuffer + readWriteBytes == currentDestBuffer");
      if (!bVar3) goto LAB_003ecb92;
      *local_50 = 0;
    }
    BVar4 = Memory::CustomHeap::
            Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
            ProtectAllocationWithExecuteReadOnly
                      (&this->allocationHeap,allocation->allocation,(char *)buffer);
    buffer = dst;
    alignPad = local_34;
    if (BVar4 == 0) {
      return false;
    }
  } while( true );
}

Assistant:

bool
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CommitBuffer(TEmitBufferAllocation* allocation, __in const size_t destBufferBytes, __out_bcount(destBufferBytes) BYTE* destBuffer, __in size_t bytes, __in_bcount(bytes) const BYTE* sourceBuffer, __in DWORD alignPad)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(destBuffer != nullptr);
    Assert(allocation != nullptr);

    // The size of destBuffer is actually given by allocation->bytesCommitted, but due to a bug in some versions of PREFast, we can't refer to allocation->bytesCommitted in the
    // SAL annotation on destBuffer above.  We've informed the PREFast maintainers, but we'll have to use destBufferBytes as a workaround until their fix makes it to Jenkins.
    Assert(destBufferBytes == allocation->bytesCommitted);
    
    // Must have at least enough room in destBuffer for the initial skipped bytes plus the bytes we're going to write.
    AnalysisAssert(allocation->bytesUsed + bytes + alignPad <= destBufferBytes);

    BYTE *currentDestBuffer = destBuffer + allocation->GetBytesUsed();
    char *bufferToFlush = allocation->allocation->address + allocation->GetBytesUsed();
    Assert(allocation->BytesFree() >= bytes + alignPad);

    size_t bytesLeft = bytes + alignPad;
    size_t sizeToFlush = bytesLeft;

    // Copy the contents and set the alignment pad
    while(bytesLeft != 0)
    {
        // currentDestBuffer must still point to somewhere in the interior of destBuffer.
        AnalysisAssert(destBuffer <= currentDestBuffer);
        AnalysisAssert(currentDestBuffer < destBuffer + destBufferBytes);

        DWORD spaceInCurrentPage = AutoSystemInfo::PageSize - ((size_t)currentDestBuffer & (AutoSystemInfo::PageSize - 1));
        size_t bytesToChange = bytesLeft > spaceInCurrentPage ? spaceInCurrentPage : bytesLeft;


        // Buffer and the bytes that are marked RWX - these will eventually be marked as 'EXCEUTE' only.
        BYTE* readWriteBuffer = currentDestBuffer;
        size_t readWriteBytes = bytesToChange;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CheckCommitFaultInjection())
        {
            return false;
        }
#endif
        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadWrite(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }

        // Pad with debug-breakpoint instructions up to alignBytes or the end of the current page, whichever is less.
        if (alignPad != 0)
        {
            DWORD alignBytes = alignPad < spaceInCurrentPage ? alignPad : spaceInCurrentPage;
            CustomHeap::FillDebugBreak(currentDestBuffer, alignBytes);

            alignPad -= alignBytes;
            currentDestBuffer += alignBytes;
            allocation->bytesUsed += alignBytes;
            bytesLeft -= alignBytes;
            bytesToChange -= alignBytes;

#if DBG_DUMP
            this->totalBytesAlignment += alignBytes;
#endif
        }

        // If there are bytes still left to be copied then we should do the copy, but only through the end of the current page.
        if(bytesToChange > 0)
        {
            AssertMsg(alignPad == 0, "If we are copying right now - we should be done with setting alignment.");

            const DWORD bufferBytesFree(allocation->BytesFree());
            // Use <= here instead of < to allow this memcopy to fill up the rest of destBuffer.  If we do, then FinalizeAllocation,
            // called below, determines that no additional padding is necessary based on the values in `allocation'.
            AnalysisAssert(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes);
            memcpy_s(currentDestBuffer, bufferBytesFree, sourceBuffer, bytesToChange);

            currentDestBuffer += bytesToChange;
            sourceBuffer += bytesToChange;
            allocation->bytesUsed += bytesToChange;
            bytesLeft -= bytesToChange;
        }

        Assert(readWriteBuffer + readWriteBytes == currentDestBuffer);

        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadOnly(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }
    }

    if (!FlushInstructionCache(this->processHandle, bufferToFlush, sizeToFlush))
    {
        return false;
    }

#if DBG_DUMP
    this->totalBytesCode += bytes;
#endif

    //Finish the current EmitBufferAllocation by filling out the rest of destBuffer with debug breakpoint instructions.
    return FinalizeAllocation(allocation, destBuffer);
}